

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O1

void __thiscall
TPZCompElWithMem<TPZInterfaceElement>::TPZCompElWithMem
          (TPZCompElWithMem<TPZInterfaceElement> *this,TPZCompMesh *mesh,
          TPZCompElWithMem<TPZInterfaceElement> *copy)

{
  *(undefined ***)&(this->super_TPZInterfaceElement).super_TPZCompEl = &PTR__TPZSavable_0194f658;
  TPZInterfaceElement::TPZInterfaceElement
            (&this->super_TPZInterfaceElement,&PTR_PTR_0194e8a0,mesh,
             &copy->super_TPZInterfaceElement);
  *(undefined ***)&(this->super_TPZInterfaceElement).super_TPZCompEl =
       &PTR__TPZCompElWithMem_0194e640;
  TPZVec<long>::TPZVec((TPZVec<long> *)&this->fIntPtIndices,0);
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore =
       (this->fIntPtIndices).super_TPZManVector<long,_128>.fExtAlloc;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements = 0;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNAlloc = 0;
  (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01962610;
  CopyIntPtIndicesFrom(this,copy);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem(TPZCompMesh &mesh, const TPZCompElWithMem<TBASE> &copy) :
TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE(mesh, copy) {
    CopyIntPtIndicesFrom(copy);
}